

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall World::drow(World *this)

{
  ostream *poVar1;
  undefined8 extraout_RDX;
  int i;
  int iVar2;
  _Rb_tree_node_base *p_Var3;
  undefined1 auVar4 [16];
  pair<const_Point,_Crearue> c;
  undefined8 uStack_60;
  undefined4 local_58;
  Crearue local_50 [2];
  
  system("clear");
  std::operator<<((ostream *)&std::cout,"|");
  for (iVar2 = 0; iVar2 < (this->world_size).super_Point.y; iVar2 = iVar2 + 1) {
    std::operator<<((ostream *)&std::cout,"-");
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"|");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<(poVar1,"|");
  auVar4._8_8_ = extraout_RDX;
  auVar4._0_8_ = (this->crearues)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (p_Var3 = auVar4._0_8_,
        (_Rb_tree_header *)p_Var3 != &(this->crearues)._M_t._M_impl.super__Rb_tree_header) {
    local_58 = *(undefined4 *)&p_Var3[1]._M_left;
    uStack_60 = p_Var3[1]._M_parent;
    Crearue::stat_abi_cxx11_(local_50,(char *)&uStack_60,auVar4._8_8_);
    std::operator<<((ostream *)&std::cout,(string *)local_50);
    std::__cxx11::string::~string((string *)local_50);
    if (uStack_60._4_4_ == (this->world_size).super_Point.y + -1) {
      poVar1 = std::operator<<((ostream *)&std::cout,"|");
      poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
      std::operator<<(poVar1,"|");
    }
    auVar4 = std::_Rb_tree_increment(p_Var3);
  }
  for (iVar2 = 0; iVar2 < (this->world_size).super_Point.y; iVar2 = iVar2 + 1) {
    std::operator<<((ostream *)&std::cout,"-");
  }
  std::operator<<((ostream *)&std::cout,"|");
  poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar1 = std::operator<<(poVar1,"Evolution: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->evol);
  std::endl<char,std::char_traits<char>>(poVar1);
  this->evol = this->evol + 1;
  return;
}

Assistant:

void drow()
		{
			system("clear");
			cout << "|";
			for(int i =0; i < world_size.y; i++)
				cout << "-";
			cout << "|" << endl << "|";
			for (auto c : this->crearues)
			{
				cout << c.second.stat();
				if(c.second.point.y == this->world_size.y -1)
					cout << "|" << endl << "|";
			}
			
			for(int i =0; i < world_size.y; i++)
				cout << "-";
			cout << "|";
			cout << endl << "Evolution: " << evol << endl ;
			evol++;
		}